

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::Image::LabeledActions::add
          (LabeledActions *this,string *label,
          MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> *action)

{
  Action *pAVar1;
  Action *pAVar2;
  int iVar3;
  long lVar4;
  
  std::__cxx11::string::_M_assign((string *)(this->m_actions + this->m_numActions));
  iVar3 = this->m_numActions;
  pAVar1 = (action->
           super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
           ).m_data.ptr;
  (action->super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
  ).m_data.ptr = (Action *)0x0;
  pAVar2 = this->m_actions[iVar3].action.
           super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
           .m_data.ptr;
  if (pAVar2 != pAVar1) {
    lVar4 = (long)iVar3;
    if (pAVar2 != (Action *)0x0) {
      (*pAVar2->_vptr_Action[1])();
      iVar3 = this->m_numActions;
    }
    this->m_actions[lVar4].action.
    super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>.m_data
    .ptr = pAVar1;
  }
  this->m_numActions = iVar3 + 1;
  return;
}

Assistant:

void LabeledActions::add (const string& label, MovePtr<Action> action)
{
	DE_ASSERT(m_numActions < DE_LENGTH_OF_ARRAY(m_actions));
	m_actions[m_numActions].label = label;
	m_actions[m_numActions].action = action;
	++m_numActions;
}